

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Vec_Int_t * Gia_MiniAigProcessFile(void)

{
  int Entry;
  Vec_Int_t *p;
  int *piVar1;
  FILE *__stream;
  char *pcVar2;
  int nLinesAll;
  uint uVar3;
  int nLines;
  uint uVar4;
  char Buffer [1000];
  char local_418 [3];
  char local_415 [997];
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar1 = (int *)malloc(400);
  p->pArray = piVar1;
  __stream = fopen("test.txt","rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open the file.");
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    while( true ) {
      pcVar2 = fgets(local_418,1000,__stream);
      if (pcVar2 == (char *)0x0) break;
      uVar3 = uVar3 + 1;
      if (local_418[0] == '#') {
        uVar4 = uVar4 + 1;
        pcVar2 = local_415;
        while( true ) {
          pcVar2 = strtok(pcVar2," \r\n\r+=");
          if (pcVar2 == (char *)0x0) break;
          Entry = atoi(pcVar2);
          Vec_IntPush(p,Entry);
          pcVar2 = (char *)0x0;
        }
      }
    }
    fclose(__stream);
    printf("Collected %d (out of %d) lines.\n",(ulong)uVar4,(ulong)uVar3);
    printf("Entries = %d\n",(ulong)(uint)p->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_MiniAigProcessFile()
{
    Vec_Int_t * vTriples = Vec_IntAlloc( 100 );
    char * pFileName = "test.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
        printf( "Cannot open the file.\n" );
    else
    {
        int nLines = 0, nLinesAll = 0;
        char * pToken;
        char Buffer[1000];
        while ( fgets( Buffer, 1000, pFile ) != NULL )
        {
            nLinesAll++;
            if ( Buffer[0] != '#' )
                continue;
            //printf( "%s", Buffer );
            nLines++;
            pToken = strtok( Buffer+3, " \r\n\r+=" );
            while ( pToken )
            {
                Vec_IntPush( vTriples, atoi(pToken) );
                pToken = strtok( NULL, " \r\n\r+=" );
            }
        }
        fclose( pFile );
        printf( "Collected %d (out of %d) lines.\n", nLines, nLinesAll );
        printf( "Entries = %d\n", Vec_IntSize(vTriples) );
    }
    return vTriples;
}